

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bibtexreader.hpp
# Opt level: O1

void __thiscall
bibtex::
BibTeXReader<boost::spirit::basic_istream_iterator<char,_std::char_traits<char>_>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::standard_wide>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<char>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_1L>_>,_2L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_2L>_>
::BibTeXReader(BibTeXReader<boost::spirit::basic_istream_iterator<char,_std::char_traits<char>_>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::standard_wide>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<char>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_1L>_>,_2L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_2L>_>
               *this)

{
  string *psVar1;
  symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
  *psVar2;
  pointer pcVar3;
  SimpleStringRule *val;
  undefined1 *puVar4;
  reference_wrapper<boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>_>
  rVar5;
  undefined8 uVar6;
  StringRule *pSVar7;
  adder *this_00;
  parser_binder<boost::spirit::qi::list<boost::spirit::qi::reference<const_boost::spirit::qi::rule<boost::spirit::basic_istream_iterator<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::standard_wide>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<char>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_1L>_>,_2L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_2L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>,_boost::spirit::qi::literal_char<boost::spirit::char_encoding::standard,_true,_false>_>,_mpl_::bool_<false>_>
  f;
  parser_binder<boost::spirit::qi::optional<boost::spirit::qi::list<boost::spirit::qi::reference<const_boost::spirit::qi::rule<boost::spirit::basic_istream_iterator<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_(),_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::standard_wide>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<char>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_1L>_>,_2L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_2L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>,_boost::spirit::qi::literal_char<boost::spirit::char_encoding::standard,_true,_false>_>_>,_mpl_::bool_<false>_>
  f_00;
  actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list4<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::assign>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::detail::member_variable<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_bibtex::BibTeXEntry::*>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<int>,_0L>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_4L>_>
  e;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>
  that;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>,_boost::fusion::vector<const_char_(&)[3]>_>_>,_0L>
  that_1;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>
  that_8;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>,_boost::fusion::vector<const_char_(&)[4]>_>_>,_0L>
  that_2;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard_wide>,_boost::fusion::vector<const_char_(&)[8]>_>_>,_0L>
  that_10;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>,_boost::fusion::vector<char>_>_>,_0L>
  that_4;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard_wide>,_boost::fusion::vector<const_char_(&)[9]>_>_>,_0L>
  that_11;
  elements_type elements;
  undefined1 local_308 [24];
  undefined4 uStack_2f0;
  undefined4 uStack_2ec;
  undefined1 local_2d1 [25];
  symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
  *local_2b8;
  SimpleStringRule *local_2b0;
  symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
  *local_2a8;
  symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
  *local_2a0 [2];
  undefined1 local_290 [32];
  shared_count sStack_270;
  _Alloc_hider local_268;
  element_type *peStack_260;
  undefined1 local_250 [8];
  rule<boost::spirit::basic_istream_iterator<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_(),_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::standard_wide>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<char>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_1L>_>,_2L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_2L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_230;
  undefined1 **local_228;
  reference_wrapper<boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>_>
  local_220;
  reference_wrapper<boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>_>
  local_218;
  SimpleStringRule *local_210;
  rule<boost::spirit::basic_istream_iterator<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_(),_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::standard_wide>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<char>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_1L>_>,_2L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_2L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_208;
  symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
  *local_200;
  symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
  *local_1f8;
  symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
  *local_1f0;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [56];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  StringRule *local_190;
  StringRule *local_188;
  symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
  *local_180;
  sp_counted_base *local_178;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>_>_>,_0L>
  local_170;
  symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
  *local_168;
  symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
  *local_160;
  symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
  *local_158;
  symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
  *local_150;
  undefined1 *local_148;
  symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
  *local_140;
  undefined1 **local_138;
  undefined1 *local_130;
  undefined1 ***local_128;
  rule<boost::spirit::basic_istream_iterator<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_(),_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::standard_wide>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<char>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_1L>_>,_2L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_2L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_120;
  undefined1 local_113 [3];
  symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
  *local_110;
  symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
  *local_108;
  string *local_100;
  
  pcVar3 = local_308 + 0x10;
  local_308._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"single BibTeX entry","");
  psVar2 = &this->start_;
  (this->
  super_grammar<boost::spirit::basic_istream_iterator<char,_std::char_traits<char>_>,_bibtex::BibTeXEntry_(),_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::standard_wide>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<char>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_1L>_>,_2L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_2L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ).super_extends<_f9105958_>.proto_expr_.child0.ref.t_ = psVar2;
  psVar1 = &(this->
            super_grammar<boost::spirit::basic_istream_iterator<char,_std::char_traits<char>_>,_bibtex::BibTeXEntry_(),_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::standard_wide>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<char>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_1L>_>,_2L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_2L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
            ).name_;
  local_1d8._32_8_ =
       &(this->
        super_grammar<boost::spirit::basic_istream_iterator<char,_std::char_traits<char>_>,_bibtex::BibTeXEntry_(),_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::standard_wide>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<char>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_1L>_>,_2L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_2L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
        ).name_.field_2;
  (this->
  super_grammar<boost::spirit::basic_istream_iterator<char,_std::char_traits<char>_>,_bibtex::BibTeXEntry_(),_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::standard_wide>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<char>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_1L>_>,_2L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_2L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ).name_._M_dataplus._M_p = (pointer)local_1d8._32_8_;
  std::__cxx11::string::_M_construct<char*>
            ((string *)psVar1,local_308._0_8_,(pointer)(local_308._0_8_ + local_308._8_8_));
  if ((pointer)local_308._0_8_ != pcVar3) {
    operator_delete((void *)local_308._0_8_,local_308._16_8_ + 1);
  }
  local_308._0_8_ = pcVar3;
  local_100 = psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"unnamed-rule","");
  (this->generic_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>_>_>,_0L>,_boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = &this->generic_;
  (this->generic_).add.sym =
       (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
        *)&(this->generic_).lookup;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->generic_).add,local_308._0_8_,
             (pointer)(local_308._0_8_ + local_308._8_8_));
  (this->generic_).name_._M_dataplus._M_p = (pointer)0x0;
  if ((pointer)local_308._0_8_ != pcVar3) {
    operator_delete((void *)local_308._0_8_,local_308._16_8_ + 1);
  }
  local_308._0_8_ = pcVar3;
  local_1f0 = &this->generic_;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"unnamed-rule","");
  (this->include_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>_>_>,_0L>,_boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = &this->include_;
  (this->include_).add.sym =
       (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
        *)&(this->include_).lookup;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->include_).add,local_308._0_8_,
             (pointer)(local_308._0_8_ + local_308._8_8_));
  (this->include_).name_._M_dataplus._M_p = (pointer)0x0;
  if ((pointer)local_308._0_8_ != pcVar3) {
    operator_delete((void *)local_308._0_8_,local_308._16_8_ + 1);
  }
  local_308._0_8_ = pcVar3;
  local_108 = &this->include_;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"unnamed-rule","");
  local_150 = &this->simple_;
  (this->simple_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>_>_>,_0L>,_boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = local_150;
  (this->simple_).add.sym =
       (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
        *)&(this->simple_).lookup;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->simple_).add,local_308._0_8_,
             (pointer)(local_308._0_8_ + local_308._8_8_));
  (this->simple_).name_._M_dataplus._M_p = (pointer)0x0;
  if ((pointer)local_308._0_8_ != pcVar3) {
    operator_delete((void *)local_308._0_8_,local_308._16_8_ + 1);
  }
  local_308._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"unnamed-rule","");
  (this->start_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>_>_>,_0L>,_boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = psVar2;
  (this->start_).add.sym =
       (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
        *)&(this->start_).lookup;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->start_).add,local_308._0_8_,
             (pointer)(local_308._0_8_ + local_308._8_8_));
  (this->start_).name_._M_dataplus._M_p = (pointer)0x0;
  if ((pointer)local_308._0_8_ != pcVar3) {
    operator_delete((void *)local_308._0_8_,local_308._16_8_ + 1);
  }
  local_308._0_8_ = pcVar3;
  local_110 = psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"unnamed-rule","");
  local_1f8 = &this->string_;
  (this->string_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>_>_>,_0L>,_boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = local_1f8;
  (this->string_).add.sym =
       (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
        *)&(this->string_).lookup;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->string_).add,local_308._0_8_,
             (pointer)(local_308._0_8_ + local_308._8_8_));
  (this->string_).name_._M_dataplus._M_p = (pointer)0x0;
  if ((pointer)local_308._0_8_ != pcVar3) {
    operator_delete((void *)local_308._0_8_,local_308._16_8_ + 1);
  }
  local_308._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"unnamed-rule","");
  local_158 = &this->entry_;
  (this->entry_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>_>_>,_0L>,_boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = local_158;
  (this->entry_).add.sym =
       (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
        *)&(this->entry_).lookup;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->entry_).add,local_308._0_8_,
             (pointer)(local_308._0_8_ + local_308._8_8_));
  (this->entry_).name_._M_dataplus._M_p = (pointer)0x0;
  if ((pointer)local_308._0_8_ != pcVar3) {
    operator_delete((void *)local_308._0_8_,local_308._16_8_ + 1);
  }
  local_308._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"unnamed-rule","");
  local_200 = &this->values_;
  (this->values_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>_>_>,_0L>,_boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = local_200;
  (this->values_).add.sym =
       (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
        *)&(this->values_).lookup;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->values_).add,local_308._0_8_,
             (pointer)(local_308._0_8_ + local_308._8_8_));
  (this->values_).name_._M_dataplus._M_p = (pointer)0x0;
  if ((pointer)local_308._0_8_ != pcVar3) {
    operator_delete((void *)local_308._0_8_,local_308._16_8_ + 1);
  }
  local_308._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"unnamed-rule","");
  local_168 = &this->junk_;
  (this->junk_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>_>_>,_0L>,_boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = local_168;
  (this->junk_).add.sym =
       (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
        *)&(this->junk_).lookup;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->junk_).add,local_308._0_8_,
             (pointer)(local_308._0_8_ + local_308._8_8_));
  (this->junk_).name_._M_dataplus._M_p = (pointer)0x0;
  if ((pointer)local_308._0_8_ != pcVar3) {
    operator_delete((void *)local_308._0_8_,local_308._16_8_ + 1);
  }
  local_308._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"unnamed-rule","");
  local_160 = &this->body_;
  (this->body_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>_>_>,_0L>,_boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = local_160;
  (this->body_).add.sym =
       (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
        *)&(this->body_).lookup;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->body_).add,local_308._0_8_,
             (pointer)(local_308._0_8_ + local_308._8_8_));
  (this->body_).name_._M_dataplus._M_p = (pointer)0x0;
  if ((pointer)local_308._0_8_ != pcVar3) {
    operator_delete((void *)local_308._0_8_,local_308._16_8_ + 1);
  }
  local_308._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"unnamed-rule","");
  local_208 = &this->field_;
  (this->field_).super_extends<_3fc76759_>.proto_expr_.child0.ref.t_ = local_208;
  (this->field_).name_._M_dataplus._M_p = (pointer)&(this->field_).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->field_).name_,local_308._0_8_,
             (pointer)(local_308._0_8_ + local_308._8_8_));
  (this->field_).f.
  super_function4<bool,_boost::spirit::basic_istream_iterator<char,_std::char_traits<char>_>_&,_const_boost::spirit::basic_istream_iterator<char,_std::char_traits<char>_>_&,_boost::spirit::context<boost::fusion::cons<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::alternative<boost::fusion::cons<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::standard_wide>_>,_boost::fusion::cons<boost::spirit::qi::sequence<boost::fusion::cons<boost::spirit::qi::literal_char<boost::spirit::char_encoding::standard,_true,_false>,_boost::fusion::cons<boost::spirit::qi::kleene<boost::spirit::qi::difference<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>,_boost::spirit::qi::eol_parser>_>,_boost::fusion::cons<boost::spirit::qi::eol_parser,_boost::fusion::nil_>_>_>_>,_boost::fusion::nil_>_>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if ((pointer)local_308._0_8_ != pcVar3) {
    operator_delete((void *)local_308._0_8_,local_308._16_8_ + 1);
  }
  local_308._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"unnamed-rule","");
  local_178 = (sp_counted_base *)&this->fields_;
  (this->fields_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>_>_>,_0L>,_boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
        *)local_178;
  (this->fields_).add.sym =
       (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
        *)&(this->fields_).lookup;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->fields_).add,local_308._0_8_,
             (pointer)(local_308._0_8_ + local_308._8_8_));
  (this->fields_).name_._M_dataplus._M_p = (pointer)0x0;
  if ((pointer)local_308._0_8_ != pcVar3) {
    operator_delete((void *)local_308._0_8_,local_308._16_8_ + 1);
  }
  local_308._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"symbols","");
  local_170.child0.ref.t_ = (proto_child0)&this->escapedBrace;
  boost::spirit::qi::
  symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>::
  symbols((symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
           *)local_170.child0.ref.t_,(string *)local_308);
  if ((pointer)local_308._0_8_ != pcVar3) {
    operator_delete((void *)local_308._0_8_,local_308._16_8_ + 1);
  }
  local_308._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"symbols","");
  local_180 = &this->escapedQuote;
  boost::spirit::qi::
  symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>::
  symbols(local_180,(string *)local_308);
  if ((pointer)local_308._0_8_ != pcVar3) {
    operator_delete((void *)local_308._0_8_,local_308._16_8_ + 1);
  }
  local_308._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"unnamed-rule","");
  local_188 = &this->quoted_;
  (this->quoted_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>_>_>,_0L>,_boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = local_188;
  (this->quoted_).add.sym =
       (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
        *)&(this->quoted_).lookup;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->quoted_).add,local_308._0_8_,
             (pointer)(local_308._0_8_ + local_308._8_8_));
  (this->quoted_).name_._M_dataplus._M_p = (pointer)0x0;
  if ((pointer)local_308._0_8_ != pcVar3) {
    operator_delete((void *)local_308._0_8_,local_308._16_8_ + 1);
  }
  local_308._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"unnamed-rule","");
  local_190 = &this->entryKey_;
  (this->entryKey_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>_>_>,_0L>,_boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = local_190;
  (this->entryKey_).add.sym =
       (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
        *)&(this->entryKey_).lookup;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->entryKey_).add,local_308._0_8_,
             (pointer)(local_308._0_8_ + local_308._8_8_));
  (this->entryKey_).name_._M_dataplus._M_p = (pointer)0x0;
  if ((pointer)local_308._0_8_ != pcVar3) {
    operator_delete((void *)local_308._0_8_,local_308._16_8_ + 1);
  }
  local_308._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"unnamed-rule","");
  local_1a0._8_8_ = &this->key_;
  (this->key_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>_>_>,_0L>,_boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
        *)local_1a0._8_8_;
  (this->key_).add.sym =
       (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
        *)&(this->key_).lookup;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->key_).add,local_308._0_8_,
             (pointer)(local_308._0_8_ + local_308._8_8_));
  (this->key_).name_._M_dataplus._M_p = (pointer)0x0;
  if ((pointer)local_308._0_8_ != pcVar3) {
    operator_delete((void *)local_308._0_8_,local_308._16_8_ + 1);
  }
  local_308._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"unnamed-rule","");
  local_1d8._48_8_ = &this->tag_;
  (this->tag_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>_>_>,_0L>,_boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
        *)local_1d8._48_8_;
  (this->tag_).add.sym =
       (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
        *)&(this->tag_).lookup;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->tag_).add,local_308._0_8_,
             (pointer)(local_308._0_8_ + local_308._8_8_));
  (this->tag_).name_._M_dataplus._M_p = (pointer)0x0;
  if ((pointer)local_308._0_8_ != pcVar3) {
    operator_delete((void *)local_308._0_8_,local_308._16_8_ + 1);
  }
  local_308._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"unnamed-rule","");
  local_1a0._M_allocated_capacity = (size_type)&this->value_;
  (this->value_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>_>_>,_0L>,_boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
        *)local_1a0._M_allocated_capacity;
  (this->value_).add.sym =
       (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
        *)&(this->value_).lookup;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->value_).add,local_308._0_8_,
             (pointer)(local_308._0_8_ + local_308._8_8_));
  (this->value_).name_._M_dataplus._M_p = (pointer)0x0;
  if ((pointer)local_308._0_8_ != pcVar3) {
    operator_delete((void *)local_308._0_8_,local_308._16_8_ + 1);
  }
  local_308._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"unnamed-rule","");
  local_210 = &this->innerBraceText_;
  (this->innerBraceText_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>_>_>,_0L>,_boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = local_210;
  (this->innerBraceText_).add.sym =
       (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
        *)&(this->innerBraceText_).lookup;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->innerBraceText_).add,local_308._0_8_,
             (pointer)(local_308._0_8_ + local_308._8_8_));
  (this->innerBraceText_).name_._M_dataplus._M_p = (pointer)0x0;
  if ((pointer)local_308._0_8_ != pcVar3) {
    operator_delete((void *)local_308._0_8_,local_308._16_8_ + 1);
  }
  local_308._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"unnamed-rule","");
  local_218.t_ = &this->escapedText_;
  (this->escapedText_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>_>_>,_0L>,_boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = local_218.t_;
  (this->escapedText_).add.sym =
       (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
        *)&(this->escapedText_).lookup;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->escapedText_).add,local_308._0_8_,
             (pointer)(local_308._0_8_ + local_308._8_8_));
  (this->escapedText_).name_._M_dataplus._M_p = (pointer)0x0;
  if ((pointer)local_308._0_8_ != pcVar3) {
    operator_delete((void *)local_308._0_8_,local_308._16_8_ + 1);
  }
  local_308._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"unnamed-rule","");
  local_1d8._40_8_ = &this->innerQuoteText_;
  (this->innerQuoteText_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>_>_>,_0L>,_boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
        *)local_1d8._40_8_;
  (this->innerQuoteText_).add.sym =
       (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
        *)&(this->innerQuoteText_).lookup;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->innerQuoteText_).add,local_308._0_8_,
             (pointer)(local_308._0_8_ + local_308._8_8_));
  (this->innerQuoteText_).name_._M_dataplus._M_p = (pointer)0x0;
  if ((pointer)local_308._0_8_ != pcVar3) {
    operator_delete((void *)local_308._0_8_,local_308._16_8_ + 1);
  }
  local_308._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"unnamed-rule","");
  local_220.t_ = &this->quoteText_;
  (this->quoteText_).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>_>_>,_0L>,_boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = local_220.t_;
  (this->quoteText_).add.sym =
       (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
        *)&(this->quoteText_).lookup;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->quoteText_).add,local_308._0_8_,
             (pointer)(local_308._0_8_ + local_308._8_8_));
  (this->quoteText_).name_._M_dataplus._M_p = (pointer)0x0;
  if ((pointer)local_308._0_8_ != pcVar3) {
    operator_delete((void *)local_308._0_8_,local_308._16_8_ + 1);
  }
  local_308[0] = (string)0x7b;
  this_00 = boost::spirit::qi::
            symbols<char,char,boost::spirit::qi::tst<char,char>,boost::spirit::qi::tst_pass_through>
            ::adder::operator()(&(this->escapedBrace).add,(char (*) [3])"\\{",local_308);
  val = (SimpleStringRule *)((long)local_290 + 0x18);
  local_290[0x18] = 0x7d;
  boost::spirit::qi::
  symbols<char,char,boost::spirit::qi::tst<char,char>,boost::spirit::qi::tst_pass_through>::adder::
  operator()(this_00,(char (*) [3])"\\}",(char *)val);
  local_308[0] = (string)0x22;
  boost::spirit::qi::
  symbols<char,char,boost::spirit::qi::tst<char,char>,boost::spirit::qi::tst_pass_through>::adder::
  operator()(&(this->escapedQuote).add,(char (*) [3])"\\\"",local_308);
  boost::
  function<bool(boost::spirit::basic_istream_iterator<char,std::char_traits<char>>&,boost::spirit::basic_istream_iterator<char,std::char_traits<char>>const&,boost::spirit::context<boost::fusion::cons<std::__cxx11::string&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::qi::alternative<boost::fusion::cons<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::standard_wide>>,boost::fusion::cons<boost::spirit::qi::sequence<boost::fusion::cons<boost::spirit::qi::literal_char<boost::spirit::char_encoding::standard,true,false>,boost::fusion::cons<boost::spirit::qi::kleene<boost::spirit::qi::difference<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::char_,boost::spirit::char_encoding::standard>>,boost::spirit::qi::eol_parser>>,boost::fusion::cons<boost::spirit::qi::eol_parser,boost::fusion::nil_>>>>,boost::fusion::nil_>>>const&)>
  ::operator=((function<bool(boost::spirit::basic_istream_iterator<char,std::char_traits<char>>&,boost::spirit::basic_istream_iterator<char,std::char_traits<char>>const&,boost::spirit::context<boost::fusion::cons<std::__cxx11::string&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::qi::alternative<boost::fusion::cons<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::standard_wide>>,boost::fusion::cons<boost::spirit::qi::sequence<boost::fusion::cons<boost::spirit::qi::literal_char<boost::spirit::char_encoding::standard,true,false>,boost::fusion::cons<boost::spirit::qi::kleene<boost::spirit::qi::difference<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::char_,boost::spirit::char_encoding::standard>>,boost::spirit::qi::eol_parser>>,boost::fusion::cons<boost::spirit::qi::eol_parser,boost::fusion::nil_>>>>,boost::fusion::nil_>>>const&)>
               *)&(this->tag_).name_);
  boost::
  function<bool(boost::spirit::basic_istream_iterator<char,std::char_traits<char>>&,boost::spirit::basic_istream_iterator<char,std::char_traits<char>>const&,boost::spirit::context<boost::fusion::cons<std::__cxx11::string&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::qi::alternative<boost::fusion::cons<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::standard_wide>>,boost::fusion::cons<boost::spirit::qi::sequence<boost::fusion::cons<boost::spirit::qi::literal_char<boost::spirit::char_encoding::standard,true,false>,boost::fusion::cons<boost::spirit::qi::kleene<boost::spirit::qi::difference<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::char_,boost::spirit::char_encoding::standard>>,boost::spirit::qi::eol_parser>>,boost::fusion::cons<boost::spirit::qi::eol_parser,boost::fusion::nil_>>>>,boost::fusion::nil_>>>const&)>
  ::operator=((function<bool(boost::spirit::basic_istream_iterator<char,std::char_traits<char>>&,boost::spirit::basic_istream_iterator<char,std::char_traits<char>>const&,boost::spirit::context<boost::fusion::cons<std::__cxx11::string&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::qi::alternative<boost::fusion::cons<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::standard_wide>>,boost::fusion::cons<boost::spirit::qi::sequence<boost::fusion::cons<boost::spirit::qi::literal_char<boost::spirit::char_encoding::standard,true,false>,boost::fusion::cons<boost::spirit::qi::kleene<boost::spirit::qi::difference<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::char_,boost::spirit::char_encoding::standard>>,boost::spirit::qi::eol_parser>>,boost::fusion::cons<boost::spirit::qi::eol_parser,boost::fusion::nil_>>>>,boost::fusion::nil_>>>const&)>
               *)&(this->entryKey_).name_,
              (parser_binder<boost::spirit::qi::lexeme_directive<boost::spirit::qi::plus<boost::spirit::qi::difference<boost::spirit::qi::negated_char_parser<boost::spirit::qi::literal_char<boost::spirit::char_encoding::standard,_false,_false>_>,_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::standard_wide>_>_>_>_>,_mpl_::bool_<false>_>
               )0x2c);
  boost::spirit::qi::char_set<boost::spirit::char_encoding::standard,_false,_false>::
  char_set<char[5]>((char_set<boost::spirit::char_encoding::standard,_false,_false> *)local_308,
                    (char (*) [5])"=,})");
  local_268._M_p = (pointer)local_308._16_8_;
  peStack_260 = (element_type *)_uStack_2f0;
  local_290._24_8_ = local_308._0_8_;
  sStack_270.pi_ = (sp_counted_base *)local_308._8_8_;
  boost::
  function<bool(boost::spirit::basic_istream_iterator<char,std::char_traits<char>>&,boost::spirit::basic_istream_iterator<char,std::char_traits<char>>const&,boost::spirit::context<boost::fusion::cons<std::__cxx11::string&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::qi::alternative<boost::fusion::cons<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::standard_wide>>,boost::fusion::cons<boost::spirit::qi::sequence<boost::fusion::cons<boost::spirit::qi::literal_char<boost::spirit::char_encoding::standard,true,false>,boost::fusion::cons<boost::spirit::qi::kleene<boost::spirit::qi::difference<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::char_,boost::spirit::char_encoding::standard>>,boost::spirit::qi::eol_parser>>,boost::fusion::cons<boost::spirit::qi::eol_parser,boost::fusion::nil_>>>>,boost::fusion::nil_>>>const&)>
  ::operator=((function<bool(boost::spirit::basic_istream_iterator<char,std::char_traits<char>>&,boost::spirit::basic_istream_iterator<char,std::char_traits<char>>const&,boost::spirit::context<boost::fusion::cons<std::__cxx11::string&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::qi::alternative<boost::fusion::cons<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::standard_wide>>,boost::fusion::cons<boost::spirit::qi::sequence<boost::fusion::cons<boost::spirit::qi::literal_char<boost::spirit::char_encoding::standard,true,false>,boost::fusion::cons<boost::spirit::qi::kleene<boost::spirit::qi::difference<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::char_,boost::spirit::char_encoding::standard>>,boost::spirit::qi::eol_parser>>,boost::fusion::cons<boost::spirit::qi::eol_parser,boost::fusion::nil_>>>>,boost::fusion::nil_>>>const&)>
               *)&(this->key_).name_,
              (parser_binder<boost::spirit::qi::lexeme_directive<boost::spirit::qi::plus<boost::spirit::qi::difference<boost::spirit::qi::negated_char_parser<boost::spirit::qi::char_set<boost::spirit::char_encoding::standard,_false,_false>_>,_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::standard_wide>_>_>_>_>,_mpl_::bool_<false>_>
               *)local_308);
  local_2d1._1_8_ = local_2d1 + 0x11;
  local_2d1[0x11] = 0x7b;
  local_308._0_8_ = local_2d1 + 1;
  local_290._0_8_ = local_2a0;
  local_2a0[0] = (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
                  *)0x1131b0;
  sStack_270.pi_ = (sp_counted_base *)local_290;
  local_290._24_8_ = local_170.child0.ref.t_;
  local_308._8_8_ = &local_2b0;
  local_2b0 = val;
  boost::spirit::qi::
  rule<boost::spirit::basic_istream_iterator<char,std::char_traits<char>>,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<false>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char>>>,0l>const&>,1l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::unary_plus,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::spirit::qi::symbols<char,char,boost::spirit::qi::tst<char,char>,boost::spirit::qi::tst_pass_through>&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::complement,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::char_code<boost::spirit::tag::char_,boost::spirit::char_encoding::standard>,boost::fusion::vector<char_const(&)[3]>>>,0l>const&>,1l>const&>,2l>const&>,1l>const&>,2l>>
            (local_218.t_,local_308);
  local_290._24_8_ = "\"{}";
  local_308._0_8_ = local_180;
  local_308._8_8_ = local_2d1 + 1;
  local_2d1._1_8_ = val;
  local_2a0[0] = (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
                  *)local_308;
  boost::spirit::qi::
  rule<boost::spirit::basic_istream_iterator<char,std::char_traits<char>>,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<false>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::unary_plus,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::spirit::qi::symbols<char,char,boost::spirit::qi::tst<char,char>,boost::spirit::qi::tst_pass_through>&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::complement,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::char_code<boost::spirit::tag::char_,boost::spirit::char_encoding::standard>,boost::fusion::vector<char_const(&)[4]>>>,0l>const&>,1l>const&>,2l>const&>,1l>>
            (local_220.t_,local_2a0);
  pSVar7 = local_188;
  rVar5.t_ = local_218.t_;
  local_2d1[0x11] = 0x7b;
  local_2b0 = local_210;
  local_2a8 = local_218.t_;
  local_290._0_8_ = &local_2b0;
  local_2d1._1_8_ = local_2d1 + 0x11;
  local_2d1._9_8_ = local_290;
  local_230._0_1_ = 0x7d;
  local_2a0[0] = (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
                  *)(local_2d1 + 1);
  local_290._24_8_ = &boost::spirit::as_string;
  local_308._0_8_ = (long)local_290 + 0x18;
  local_308._8_8_ = local_218.t_;
  local_2a0[1] = (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
                  *)&local_230;
  sStack_270.pi_ = (sp_counted_base *)local_2a0;
  boost::spirit::qi::
  rule<boost::spirit::basic_istream_iterator<char,std::char_traits<char>>,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::as_string>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::char_code<boost::spirit::tag::char_,boost::spirit::char_encoding::standard>,boost::fusion::vector<char>>>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::spirit::qi::rule<boost::spirit::basic_istream_iterator<char,std::char_traits<char>>,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>&,boost::spirit::qi::rule<boost::spirit::basic_istream_iterator<char,std::char_traits<char>>,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>&>,2l>const&>,1l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::char_code<boost::spirit::tag::char_,boost::spirit::char_encoding::standard>,boost::fusion::vector<char>>>,0l>const&>,2l>const&>,2l>const&,boost::spirit::qi::rule<boost::spirit::basic_istream_iterator<char,std::char_traits<char>>,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>&>,2l>>
            ();
  uVar6 = local_1d8._40_8_;
  local_2d1[0x11] = 0x7b;
  local_2b0 = (SimpleStringRule *)local_1d8._40_8_;
  local_2a8 = rVar5.t_;
  local_290._0_8_ = &local_2b0;
  local_2d1._1_8_ = local_2d1 + 0x11;
  local_2d1._9_8_ = local_290;
  local_230 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_230._1_7_,0x7d);
  local_2a0[0] = (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
                  *)(local_2d1 + 1);
  local_290._24_8_ = &boost::spirit::as_string;
  local_308._0_8_ = (long)local_290 + 0x18;
  local_308._8_8_ = local_220.t_;
  local_2a0[1] = (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
                  *)&local_230;
  sStack_270.pi_ = (sp_counted_base *)local_2a0;
  boost::spirit::qi::
  rule<boost::spirit::basic_istream_iterator<char,std::char_traits<char>>,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::as_string>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::char_code<boost::spirit::tag::char_,boost::spirit::char_encoding::standard>,boost::fusion::vector<char>>>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::spirit::qi::rule<boost::spirit::basic_istream_iterator<char,std::char_traits<char>>,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>&,boost::spirit::qi::rule<boost::spirit::basic_istream_iterator<char,std::char_traits<char>>,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>&>,2l>const&>,1l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::char_code<boost::spirit::tag::char_,boost::spirit::char_encoding::standard>,boost::fusion::vector<char>>>,0l>const&>,2l>const&>,2l>const&,boost::spirit::qi::rule<boost::spirit::basic_istream_iterator<char,std::char_traits<char>>,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>&>,2l>>
            (local_1d8._40_8_);
  psVar2 = local_160;
  local_2b0 = (SimpleStringRule *)local_1d8;
  local_1d8[0] = 0x22;
  local_230 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)uVar6;
  local_2d1._9_8_ = local_250;
  local_250[0] = '\"';
  local_2d1._1_8_ = &local_2b0;
  local_2d1._17_8_ = local_1d8 + 0x10;
  local_1d8[0x10] = 0x7b;
  local_2b8 = (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
               *)&local_240;
  local_240._0_8_ = local_210;
  local_290._8_8_ = local_1e8;
  local_1e8[0] = 0x7d;
  local_290._0_8_ = (long)local_2d1 + 0x11;
  puVar4 = local_2d1 + 1;
  local_2a0[1] = (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
                  *)local_290;
  local_290._24_8_ = &boost::spirit::lexeme;
  local_308._0_8_ = (long)local_290 + 0x18;
  local_308._8_8_ = &local_128;
  local_2a8 = (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
               *)&local_230;
  local_2a0[0] = (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
                  *)puVar4;
  sStack_270.pi_ = (sp_counted_base *)local_2a0;
  boost::spirit::qi::
  rule<boost::spirit::basic_istream_iterator<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::standard_wide>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<char>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_1L>_>,_2L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_2L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::define<_39ae72b5_>(pSVar7);
  uVar6 = local_1a0._M_allocated_capacity;
  local_290._24_8_ = ",})#";
  local_2d1._1_8_ = (long)local_290 + 0x18;
  local_308._0_8_ = pSVar7;
  local_308._8_8_ = local_2a0;
  local_2a0[0] = (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
                  *)puVar4;
  boost::spirit::qi::
  rule<boost::spirit::basic_istream_iterator<char,std::char_traits<char>>,std::__cxx11::string(),boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::standard_wide>>,0l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char>,0l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::char_,boost::spirit::char_encoding::standard>>,0l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::eol>,0l>>,2l>>,1l>>,2l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::eol>,0l>>,2l>>,2l>const,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<false>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::spirit::qi::rule<boost::spirit::basic_istream_iterator<char,std::char_traits<char>>,std::__cxx11::string(),boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::standard_wide>>,0l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char>,0l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,boost::proto::argsns_____encoding::standard>,boost::fusion::vector<char_const(&)[5]>>>,0l>const&>,1l>const&>,1l>const&>,2l>>
            (local_1a0._M_allocated_capacity);
  f.p._8_8_ = 0x23;
  f.p.left.ref.t_ =
       (reference_wrapper<boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>_>
        )(symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
          *)*(reference_wrapper<boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>_>
              *)uVar6;
  boost::
  function<bool_(boost::spirit::basic_istream_iterator<char,_std::char_traits<char>_>_&,_const_boost::spirit::basic_istream_iterator<char,_std::char_traits<char>_>_&,_boost::spirit::context<boost::fusion::cons<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::alternative<boost::fusion::cons<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::standard_wide>_>,_boost::fusion::cons<boost::spirit::qi::sequence<boost::fusion::cons<boost::spirit::qi::literal_char<boost::spirit::char_encoding::standard,_true,_false>,_boost::fusion::cons<boost::spirit::qi::kleene<boost::spirit::qi::difference<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>,_boost::spirit::qi::eol_parser>_>,_boost::fusion::cons<boost::spirit::qi::eol_parser,_boost::fusion::nil_>_>_>_>,_boost::fusion::nil_>_>_>_&)>
  ::
  operator=<boost::spirit::qi::detail::parser_binder<boost::spirit::qi::list<boost::spirit::qi::reference<const_boost::spirit::qi::rule<boost::spirit::basic_istream_iterator<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::standard_wide>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<char>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_1L>_>,_2L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_2L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>,_boost::spirit::qi::literal_char<boost::spirit::char_encoding::standard,_true,_false>_>,_mpl_::bool_<false>_>_>
            ((function<bool_(boost::spirit::basic_istream_iterator<char,_std::char_traits<char>_>_&,_const_boost::spirit::basic_istream_iterator<char,_std::char_traits<char>_>_&,_boost::spirit::context<boost::fusion::cons<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::alternative<boost::fusion::cons<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::standard_wide>_>,_boost::fusion::cons<boost::spirit::qi::sequence<boost::fusion::cons<boost::spirit::qi::literal_char<boost::spirit::char_encoding::standard,_true,_false>,_boost::fusion::cons<boost::spirit::qi::kleene<boost::spirit::qi::difference<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>,_boost::spirit::qi::eol_parser>_>,_boost::fusion::cons<boost::spirit::qi::eol_parser,_boost::fusion::nil_>_>_>_>,_boost::fusion::nil_>_>_>_&)>
              *)&(this->values_).name_,f);
  local_308._16_8_ =
       (local_200->
       super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>_>_>,_0L>,_boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>,_boost::proto::domainns_::default_domain,_0L>
       ).proto_expr_.child0.ref.t_;
  local_308._0_8_ = *(undefined8 *)local_1a0._8_8_;
  local_308[8] = 0x3d;
  boost::
  function<bool_(boost::spirit::basic_istream_iterator<char,_std::char_traits<char>_>_&,_const_boost::spirit::basic_istream_iterator<char,_std::char_traits<char>_>_&,_boost::spirit::context<boost::fusion::cons<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::alternative<boost::fusion::cons<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::standard_wide>_>,_boost::fusion::cons<boost::spirit::qi::sequence<boost::fusion::cons<boost::spirit::qi::literal_char<boost::spirit::char_encoding::standard,_true,_false>,_boost::fusion::cons<boost::spirit::qi::kleene<boost::spirit::qi::difference<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>,_boost::spirit::qi::eol_parser>_>,_boost::fusion::cons<boost::spirit::qi::eol_parser,_boost::fusion::nil_>_>_>_>,_boost::fusion::nil_>_>_>_&)>
  ::operator=<_f5116fb0_>(&(this->field_).f,(parser_binder<_108ea925_> *)local_308);
  f_00.p.subject._8_8_ = 0x2c;
  f_00.p.subject.left.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<boost::spirit::basic_istream_iterator<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_(),_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::standard_wide>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<char>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_1L>_>,_2L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_2L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<boost::spirit::basic_istream_iterator<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_(),_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::standard_wide>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<char>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_1L>_>,_2L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_2L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )(local_208->super_extends<_3fc76759_>).proto_expr_.child0.ref.t_;
  boost::
  function<bool_(boost::spirit::basic_istream_iterator<char,_std::char_traits<char>_>_&,_const_boost::spirit::basic_istream_iterator<char,_std::char_traits<char>_>_&,_boost::spirit::context<boost::fusion::cons<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::alternative<boost::fusion::cons<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::standard_wide>_>,_boost::fusion::cons<boost::spirit::qi::sequence<boost::fusion::cons<boost::spirit::qi::literal_char<boost::spirit::char_encoding::standard,_true,_false>,_boost::fusion::cons<boost::spirit::qi::kleene<boost::spirit::qi::difference<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>,_boost::spirit::qi::eol_parser>_>,_boost::fusion::cons<boost::spirit::qi::eol_parser,_boost::fusion::nil_>_>_>_>,_boost::fusion::nil_>_>_>_&)>
  ::
  operator=<boost::spirit::qi::detail::parser_binder<boost::spirit::qi::optional<boost::spirit::qi::list<boost::spirit::qi::reference<const_boost::spirit::qi::rule<boost::spirit::basic_istream_iterator<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_(),_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::standard_wide>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<char>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_1L>_>,_2L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_2L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>,_boost::spirit::qi::literal_char<boost::spirit::char_encoding::standard,_true,_false>_>_>,_mpl_::bool_<false>_>_>
            ((function<bool_(boost::spirit::basic_istream_iterator<char,_std::char_traits<char>_>_&,_const_boost::spirit::basic_istream_iterator<char,_std::char_traits<char>_>_&,_boost::spirit::context<boost::fusion::cons<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::alternative<boost::fusion::cons<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::standard_wide>_>,_boost::fusion::cons<boost::spirit::qi::sequence<boost::fusion::cons<boost::spirit::qi::literal_char<boost::spirit::char_encoding::standard,_true,_false>,_boost::fusion::cons<boost::spirit::qi::kleene<boost::spirit::qi::difference<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>,_boost::spirit::qi::eol_parser>_>,_boost::fusion::cons<boost::spirit::qi::eol_parser,_boost::fusion::nil_>_>_>_>,_boost::fusion::nil_>_>_>_&)>
              *)&(this->fields_).name_,f_00);
  local_2d1._1_8_ = local_190;
  local_2d1[0x11] = 0x2c;
  sStack_270.pi_ = local_178;
  local_290[0] = 0x2c;
  local_308._0_8_ = (pointer)((long)local_290 + 0x18U);
  local_308._8_8_ =
       (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
        *)&local_2b0;
  local_2b0 = (SimpleStringRule *)local_290;
  local_2a0[0] = (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
                  *)puVar4;
  local_2a0[1] = (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
                  *)(local_2d1 + 0x11);
  local_290._24_8_ = local_2a0;
  boost::spirit::qi::
  rule<boost::spirit::basic_istream_iterator<char,std::char_traits<char>>,boost::fusion::vector<boost::optional<std::__cxx11::string>,std::vector<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>>(),boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::standard_wide>>,0l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char>,0l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::char_,boost::spirit::char_encoding::standard>>,0l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::eol>,0l>>,2l>>,1l>>,2l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::eol>,0l>>,2l>>,2l>const,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<false>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,boost::proto::argsns_::list1<boost::spirit::qi::rule<boost::spirit::basic_istream_iterator<char,std::char_traits<char>>,std::__cxx11::string(),boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::standard_wide>>,0l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::li___spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char>>>,0l>const&>,1l>const&>,2l>>
            (psVar2);
  local_250[0] = 0x40;
  local_2a0[0] = (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
                  *)local_1d8._48_8_;
  local_2a0[1] = (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
                  *)local_1d8;
  local_290._24_8_ = local_250;
  local_1d8[0x10] = 0x7b;
  local_2d1._17_8_ = local_1d8 + 0x10;
  local_2b8 = psVar2;
  local_1e8[0] = 0x7d;
  local_290._0_8_ = (long)local_2d1 + 0x11;
  local_290._8_8_ = local_1e8;
  local_240._M_allocated_capacity = (size_type)&local_138;
  local_138._0_1_ = 0x28;
  local_240._8_8_ = psVar2;
  local_228 = &local_148;
  local_148._0_1_ = 0x29;
  local_230 = &local_240;
  local_308._8_8_ = local_2d1 + 1;
  local_308._0_8_ = (pointer)((long)local_290 + 0x18U);
  local_2d1._1_8_ =
       (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
        *)&local_2b0;
  local_2d1._9_8_ = &local_128;
  local_2b0 = (SimpleStringRule *)local_290;
  local_2a8 = (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
               *)&local_230;
  sStack_270.pi_ = (sp_counted_base *)local_2a0;
  boost::spirit::qi::
  rule<boost::spirit::basic_istream_iterator<char,_std::char_traits<char>_>,_bibtex::BibTeXEntry_(),_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::standard_wide>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<char>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_1L>_>,_2L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_2L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::define<_63a054f5_>(local_1f0,local_308);
  local_1e8[0] = 0x40;
  local_290._0_8_ = "string";
  local_2a8 = (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
               *)(local_1d8 + 0x10);
  local_2d1._1_8_ = &boost::spirit::standard_wide::no_case;
  local_2a0[0] = (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
                  *)local_1e8;
  local_2a0[1] = (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
                  *)(local_2d1 + 1);
  local_138 = (undefined1 **)CONCAT71(local_138._1_7_,0x7b);
  local_128 = &local_138;
  local_120 = local_208;
  local_148 = (undefined1 *)CONCAT71(local_148._1_7_,0x7d);
  local_240._8_8_ = &local_148;
  local_113[0] = 0x28;
  local_248 = local_208;
  local_2d1[0] = 0x29;
  local_1d8._0_8_ = local_250;
  local_230 = &local_240;
  local_228 = (undefined1 **)local_1d8;
  local_308._8_8_ =
       (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
        *)0x48;
  uStack_2f0 = 1;
  local_290._24_8_ = local_2a0;
  sStack_270.pi_ = (sp_counted_base *)(local_2d1 + 0x11);
  local_2d1._9_8_ =
       (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
        *)&local_2b0;
  local_2d1._17_8_ = &local_230;
  local_2b8 = (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
               *)local_308;
  local_2b0 = (SimpleStringRule *)local_290;
  local_250 = (undefined1  [8])local_113;
  local_240._M_allocated_capacity = (size_type)&local_128;
  local_1d8._8_8_ =
       (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
        *)local_2d1;
  boost::spirit::qi::
  rule<boost::spirit::basic_istream_iterator<char,_std::char_traits<char>_>,_bibtex::BibTeXEntry_(),_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::standard_wide>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<char>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_1L>_>,_2L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_2L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::define<_7ad13d43_>(local_1f8);
  psVar2 = local_150;
  local_230 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x1131bf;
  local_240._M_allocated_capacity = (size_type)"include";
  local_2b8 = (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
               *)&local_240;
  local_128 = (undefined1 ***)0x1131cf;
  local_290._0_8_ = (long)local_2d1 + 0x11;
  local_290._8_8_ = &local_128;
  local_2b0 = (SimpleStringRule *)local_290;
  local_2d1._1_8_ = &boost::spirit::standard_wide::no_case;
  local_2d1._9_8_ = &local_2b0;
  local_2a0[1] = (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
                  *)(local_2d1 + 1);
  local_1e8._0_8_ = (long)local_290 + 0x17;
  local_290[0x17] = 0x7b;
  local_1d8._16_8_ = local_1e8;
  local_1d8._24_8_ = (long)local_290 + 0x16;
  local_290[0x16] = 0x7d;
  local_148 = (undefined1 *)((long)local_290 + 0x15);
  local_290[0x15] = 0x28;
  local_138 = &local_148;
  local_130 = local_290 + 0x14;
  local_290[0x14] = 0x29;
  local_250 = (undefined1  [8])(local_1d8 + 0x10);
  local_248 = (rule<boost::spirit::basic_istream_iterator<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_(),_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::standard_wide>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<char>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_1L>_>,_2L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_2L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
               *)&local_138;
  local_1d8._0_8_ = local_250;
  local_290._24_8_ = local_2a0;
  sStack_270.pi_ = (sp_counted_base *)local_1d8;
  local_2d1[0] = 0x40;
  local_1e8._8_8_ = local_200;
  local_140 = local_200;
  local_308._8_8_ =
       (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
        *)0x48;
  uStack_2f0 = 1;
  local_2d1._17_8_ = &local_230;
  local_2a8 = (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
               *)local_113;
  local_2a0[0] = (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
                  *)local_2d1;
  local_1d8._8_8_ =
       (symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>
        *)local_308;
  boost::spirit::qi::
  rule<boost::spirit::basic_istream_iterator<char,_std::char_traits<char>_>,_bibtex::BibTeXEntry_(),_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::standard_wide>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<char>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_1L>_>,_2L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_2L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::define<_6d3c1003_>(local_150);
  local_308._16_8_ =
       (local_1f0->
       super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>_>_>,_0L>,_boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>,_boost::proto::domainns_::default_domain,_0L>
       ).proto_expr_.child0.ref.t_;
  local_308._8_8_ =
       (psVar2->
       super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>_>_>,_0L>,_boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>,_boost::proto::domainns_::default_domain,_0L>
       ).proto_expr_.child0.ref.t_;
  local_308._0_8_ =
       (local_1f8->
       super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>_>_>,_0L>,_boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>,_boost::proto::domainns_::default_domain,_0L>
       ).proto_expr_.child0.ref.t_;
  boost::
  function<bool_(boost::spirit::basic_istream_iterator<char,_std::char_traits<char>_>_&,_const_boost::spirit::basic_istream_iterator<char,_std::char_traits<char>_>_&,_boost::spirit::context<boost::fusion::cons<bibtex::BibTeXEntry_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::alternative<boost::fusion::cons<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::standard_wide>_>,_boost::fusion::cons<boost::spirit::qi::sequence<boost::fusion::cons<boost::spirit::qi::literal_char<boost::spirit::char_encoding::standard,_true,_false>,_boost::fusion::cons<boost::spirit::qi::kleene<boost::spirit::qi::difference<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>,_boost::spirit::qi::eol_parser>_>,_boost::fusion::cons<boost::spirit::qi::eol_parser,_boost::fusion::nil_>_>_>_>,_boost::fusion::nil_>_>_>_&)>
  ::operator=<_ac06efb_>
            ((function<bool_(boost::spirit::basic_istream_iterator<char,_std::char_traits<char>_>_&,_const_boost::spirit::basic_istream_iterator<char,_std::char_traits<char>_>_&,_boost::spirit::context<boost::fusion::cons<bibtex::BibTeXEntry_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::alternative<boost::fusion::cons<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::standard_wide>_>,_boost::fusion::cons<boost::spirit::qi::sequence<boost::fusion::cons<boost::spirit::qi::literal_char<boost::spirit::char_encoding::standard,_true,_false>,_boost::fusion::cons<boost::spirit::qi::kleene<boost::spirit::qi::difference<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>,_boost::spirit::qi::eol_parser>_>,_boost::fusion::cons<boost::spirit::qi::eol_parser,_boost::fusion::nil_>_>_>_>,_boost::fusion::nil_>_>_>_&)>
              *)&(this->entry_).name_,(parser_binder<_fdc77770_> *)local_308);
  psVar2 = local_158;
  boost::
  function<bool(boost::spirit::basic_istream_iterator<char,std::char_traits<char>>&,boost::spirit::basic_istream_iterator<char,std::char_traits<char>>const&,boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::qi::alternative<boost::fusion::cons<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::standard_wide>>,boost::fusion::cons<boost::spirit::qi::sequence<boost::fusion::cons<boost::spirit::qi::literal_char<boost::spirit::char_encoding::standard,true,false>,boost::fusion::cons<boost::spirit::qi::kleene<boost::spirit::qi::difference<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::char_,boost::spirit::char_encoding::standard>>,boost::spirit::qi::eol_parser>>,boost::fusion::cons<boost::spirit::qi::eol_parser,boost::fusion::nil_>>>>,boost::fusion::nil_>>>const&)>
  ::operator=((function<bool(boost::spirit::basic_istream_iterator<char,std::char_traits<char>>&,boost::spirit::basic_istream_iterator<char,std::char_traits<char>>const&,boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::qi::alternative<boost::fusion::cons<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::standard_wide>>,boost::fusion::cons<boost::spirit::qi::sequence<boost::fusion::cons<boost::spirit::qi::literal_char<boost::spirit::char_encoding::standard,true,false>,boost::fusion::cons<boost::spirit::qi::kleene<boost::spirit::qi::difference<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::char_,boost::spirit::char_encoding::standard>>,boost::spirit::qi::eol_parser>>,boost::fusion::cons<boost::spirit::qi::eol_parser,boost::fusion::nil_>>>>,boost::fusion::nil_>>>const&)>
               *)&(this->junk_).name_,
              (parser_binder<boost::spirit::qi::kleene<boost::spirit::qi::negated_char_parser<boost::spirit::qi::literal_char<boost::spirit::char_encoding::standard,_true,_false>_>_>,_mpl_::bool_<false>_>
               )0x40);
  local_308._8_8_ =
       (psVar2->
       super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>_>_>,_0L>,_boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>,_boost::proto::domainns_::default_domain,_0L>
       ).proto_expr_.child0.ref.t_;
  local_308._0_8_ =
       (local_168->
       super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>_>_>,_0L>,_boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>,_boost::proto::domainns_::default_domain,_0L>
       ).proto_expr_.child0.ref.t_;
  boost::
  function<bool_(boost::spirit::basic_istream_iterator<char,_std::char_traits<char>_>_&,_const_boost::spirit::basic_istream_iterator<char,_std::char_traits<char>_>_&,_boost::spirit::context<boost::fusion::cons<bibtex::BibTeXEntry_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::alternative<boost::fusion::cons<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::standard_wide>_>,_boost::fusion::cons<boost::spirit::qi::sequence<boost::fusion::cons<boost::spirit::qi::literal_char<boost::spirit::char_encoding::standard,_true,_false>,_boost::fusion::cons<boost::spirit::qi::kleene<boost::spirit::qi::difference<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>,_boost::spirit::qi::eol_parser>_>,_boost::fusion::cons<boost::spirit::qi::eol_parser,_boost::fusion::nil_>_>_>_>,_boost::fusion::nil_>_>_>_&)>
  ::operator=<_73f3a311_>
            ((function<bool_(boost::spirit::basic_istream_iterator<char,_std::char_traits<char>_>_&,_const_boost::spirit::basic_istream_iterator<char,_std::char_traits<char>_>_&,_boost::spirit::context<boost::fusion::cons<bibtex::BibTeXEntry_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::alternative<boost::fusion::cons<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::standard_wide>_>,_boost::fusion::cons<boost::spirit::qi::sequence<boost::fusion::cons<boost::spirit::qi::literal_char<boost::spirit::char_encoding::standard,_true,_false>,_boost::fusion::cons<boost::spirit::qi::kleene<boost::spirit::qi::difference<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>,_boost::spirit::qi::eol_parser>_>,_boost::fusion::cons<boost::spirit::qi::eol_parser,_boost::fusion::nil_>_>_>_>,_boost::fusion::nil_>_>_>_&)>
              *)&(this->start_).name_,(parser_binder<_4e7566c6_> *)local_308);
  return;
}

Assistant:

BibTeXReader()
        : BibTeXReader::base_type(start_, "single BibTeX entry")
    {
        using namespace boost::spirit;
        namespace ph = boost::phoenix;
        namespace sn = detail::encoding;

        escapedBrace.add
            ("\\{", '{')
            ("\\}", '}')
            ;
        escapedQuote.add
            ("\\\"", '"')
            ;

        tag_ = +detail::encoding::alnum;
        entryKey_ = qi::lexeme[+(~qi::char_(',') - sn::space)];
        key_ = qi::lexeme[+(~qi::char_("=,})") - sn::space)];

        escapedText_
            = !qi::lit('{') >> +(escapedBrace | ~qi::char_("{}"))
            ;

        quoteText_
            = +(escapedQuote | ~qi::char_("\"{}"))
            ;

        innerBraceText_
            %=
            qi::as_string
            [
                qi::char_('{')
                >>
                    *(innerBraceText_ | escapedText_)
                >>
                qi::char_('}')
            ]
            |
            escapedText_
            ;

        innerQuoteText_
            %=
            qi::as_string
            [
                qi::char_('{')
                >>
                    *(innerQuoteText_ | escapedText_)
                >>
                qi::char_('}')
            ]
            |
            quoteText_
            ;

        quoted_
            = qi::lexeme
            [
                ( '"' >> *innerQuoteText_ >> '"' )
                |
                ( '{' >> *innerBraceText_ >> '}' )
            ]
            [
                _val = ph::accumulate(_1, ph::construct<std::string>())
            ]
            ;

        value_
            = quoted_
            | +~qi::char_(",})#")
            ;

        values_
            = value_ % '#'
            ;

        field_
            = key_ >> '=' >> values_
            ;

        fields_ = -(field_ % ',');

        body_
            = -entryKey_ >> ',' // tolerate an empty key
            >> fields_
            >> -qi::lit(',') // accept a trailing comma
            ;

        generic_
            =
            '@' >> tag_
            [
                ph::at_c<0>(_val) = _1
            ]
            >>
            (
                ('{' >> body_ >> '}')
                |
                ('(' >> body_ >> ')')
            )
            [
                ph::at_c<1>(_val) = ph::at_c<0>(_1),
                ph::at_c<2>(_val) = ph::at_c<1>(_1)
            ]
            ;

        string_
            =
            '@' >> sn::no_case
            [
                qi::string("string")
                [
                    ph::at_c<0>(_val) = _1
                ]
            ]
            >>
            (
                ('{' >> field_ >> '}')
                |
                ('(' >> field_ >> ')')
            )
            [
                ph::assign(ph::bind(&BibTeXEntry::fields, _val), 1, _1)
            ]
            ;

        simple_
            =
            '@' >> sn::no_case
            [
                (
                    sn::string("comment")
                    |
                    sn::string("include")
                    |
                    sn::string("preamble")
                )
                [
                    ph::at_c<0>(_val) = _1
                ]
            ]
            >>
            (
                ('{' >> values_ >> '}')
                |
                ('(' >> values_ >> ')')
            )
            [
                ph::assign(ph::bind(&BibTeXEntry::fields, _val), 1,
                    ph::construct<KeyValue>
                        (ph::construct<KeyValue::first_type>(), _1))
            ]
            ;

        entry_
            = string_
            | simple_
            | generic_
            ;

        junk_
            = *~qi::lit('@')
            ;

        start_
            = junk_ >> entry_
            ;
    }